

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O3

size_t __thiscall
gmlc::concurrency::DelayedDestructor<helics::Broker>::destroyObjects
          (DelayedDestructor<helics::Broker> *this,milliseconds delay)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  pointer psVar4;
  int iVar5;
  size_t sVar6;
  pointer psVar7;
  milliseconds delayTime;
  unique_lock<std::timed_mutex> lock;
  milliseconds minDelay;
  duration<long,_std::ratio<1L,_1000L>_> local_70;
  int local_64;
  unique_lock<std::timed_mutex> local_60;
  ulong local_50;
  timespec local_48;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  local_60._M_owns = false;
  local_38.__r = 200;
  if (200 < delay.__r) {
    local_38.__r = delay.__r;
  }
  local_60._M_device = &this->destructionLock;
  local_50 = delay.__r;
  bVar1 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    (&local_60,&local_38);
  sVar6 = 0xffffffffffffffff;
  if (bVar1) {
    local_70.__r = 0x32;
    if ((long)local_50 < 100) {
      local_70.__r = local_50;
    }
    local_64 = 1;
    if (99 < (long)local_50) {
      local_64 = (int)(local_50 / 0x32);
    }
    psVar4 = (this->ElementsToBeDestroyed).
             super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar7 = (this->ElementsToBeDestroyed).
             super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (0 < local_64 && (long)psVar7 - (long)psVar4 != 0) {
      sVar6 = (long)psVar7 - (long)psVar4 >> 4;
      iVar5 = 0;
      do {
        if (iVar5 != 0 && 4 < (long)local_50) {
          std::unique_lock<std::timed_mutex>::unlock(&local_60);
          if (0 < local_70.__r) {
            local_48.tv_sec = (ulong)local_70.__r / 1000;
            local_48.tv_nsec = ((ulong)local_70.__r % 1000) * 1000000;
            do {
              iVar2 = nanosleep(&local_48,&local_48);
              if (iVar2 != -1) break;
              piVar3 = __errno_location();
            } while (*piVar3 == 4);
          }
          bVar1 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                            (&local_60,&local_70);
          if (!bVar1) goto LAB_002dd6c5;
        }
        psVar4 = (this->ElementsToBeDestroyed).
                 super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar7 = (this->ElementsToBeDestroyed).
                 super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        sVar6 = (long)psVar7 - (long)psVar4 >> 4;
        if (psVar7 != psVar4) {
          std::unique_lock<std::timed_mutex>::unlock(&local_60);
          destroyObjects(this);
          bVar1 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                            (&local_60,&local_70);
          if (!bVar1) goto LAB_002dd6c5;
        }
      } while ((psVar7 != psVar4) && (iVar5 = iVar5 + 1, iVar5 < local_64));
      psVar4 = (this->ElementsToBeDestroyed).
               super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar7 = (this->ElementsToBeDestroyed).
               super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    sVar6 = (long)psVar7 - (long)psVar4 >> 4;
  }
LAB_002dd6c5:
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_60);
  return sVar6;
}

Assistant:

size_t destroyObjects(std::chrono::milliseconds delay)
    {
        using namespace std::literals::chrono_literals;
        std::unique_lock<std::timed_mutex> lock(destructionLock,
                                                std::defer_lock);
        auto minDelay = (delay > 200ms) ? delay : 200ms;
        if (!lock.try_lock_for(minDelay)) {
            return static_cast<size_t>(-1);
        }
        auto delayTime = (delay < 100ms) ? delay : 50ms;
        int delayCount =
            (delay < 100ms) ? 1 : static_cast<int>((delay.count() / 50));

        int cnt = 0;
        auto elementSize = ElementsToBeDestroyed.size();
        while (elementSize > 0 && (cnt < delayCount)) {
            if (cnt > 0)  // don't sleep on the first loop
            {
                if (delay > 4ms) {
                    lock.unlock();
                    std::this_thread::sleep_for(delayTime);
                    if (!lock.try_lock_for(delayTime)) {
                        return elementSize;
                    }
                }
            }
            ++cnt;
            elementSize = ElementsToBeDestroyed.size();
            if (elementSize > 0) {
                lock.unlock();
                destroyObjects();
                if (!lock.try_lock_for(delayTime)) {
                    return elementSize;
                }
            }
        }
        return ElementsToBeDestroyed.size();
    }